

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.cpp
# Opt level: O0

bool CombinePSBTs(PartiallySignedTransaction *out,
                 vector<PartiallySignedTransaction,_std::allocator<PartiallySignedTransaction>_>
                 *psbtxs)

{
  long lVar1;
  bool bVar2;
  const_iterator __lhs;
  PartiallySignedTransaction *in_RDI;
  long in_FS_OFFSET;
  __normal_iterator<const_PartiallySignedTransaction_*,_std::vector<PartiallySignedTransaction,_std::allocator<PartiallySignedTransaction>_>_>
  it;
  PartiallySignedTransaction *in_stack_00000040;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  __normal_iterator<const_PartiallySignedTransaction_*,_std::vector<PartiallySignedTransaction,_std::allocator<PartiallySignedTransaction>_>_>
  in_stack_ffffffffffffffc0;
  PartiallySignedTransaction *in_stack_ffffffffffffffc8;
  undefined1 local_19;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<PartiallySignedTransaction,_std::allocator<PartiallySignedTransaction>_>::operator[]
            ((vector<PartiallySignedTransaction,_std::allocator<PartiallySignedTransaction>_> *)
             in_stack_ffffffffffffffc8,(size_type)in_stack_ffffffffffffffc0._M_current);
  PartiallySignedTransaction::operator=
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0._M_current);
  __lhs = std::vector<PartiallySignedTransaction,_std::allocator<PartiallySignedTransaction>_>::
          begin(in_stack_ffffffffffffffc0._M_current);
  std::
  next<__gnu_cxx::__normal_iterator<PartiallySignedTransaction_const*,std::vector<PartiallySignedTransaction,std::allocator<PartiallySignedTransaction>>>>
            (in_stack_ffffffffffffffc0,CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8)
            );
  do {
    std::vector<PartiallySignedTransaction,_std::allocator<PartiallySignedTransaction>_>::end
              ((vector<PartiallySignedTransaction,_std::allocator<PartiallySignedTransaction>_> *)
               in_stack_ffffffffffffffc0._M_current);
    bVar2 = __gnu_cxx::
            operator==<const_PartiallySignedTransaction_*,_std::vector<PartiallySignedTransaction,_std::allocator<PartiallySignedTransaction>_>_>
                      ((__normal_iterator<const_PartiallySignedTransaction_*,_std::vector<PartiallySignedTransaction,_std::allocator<PartiallySignedTransaction>_>_>
                        *)__lhs._M_current,
                       (__normal_iterator<const_PartiallySignedTransaction_*,_std::vector<PartiallySignedTransaction,_std::allocator<PartiallySignedTransaction>_>_>
                        *)in_stack_ffffffffffffffc0._M_current);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      local_19 = true;
LAB_019991d3:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return local_19;
      }
      __stack_chk_fail();
    }
    in_stack_ffffffffffffffc0._M_current = in_RDI;
    __gnu_cxx::
    __normal_iterator<const_PartiallySignedTransaction_*,_std::vector<PartiallySignedTransaction,_std::allocator<PartiallySignedTransaction>_>_>
    ::operator*((__normal_iterator<const_PartiallySignedTransaction_*,_std::vector<PartiallySignedTransaction,_std::allocator<PartiallySignedTransaction>_>_>
                 *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
    bVar2 = PartiallySignedTransaction::Merge(in_stack_00000040,it._M_current);
    if (!bVar2) {
      local_19 = false;
      goto LAB_019991d3;
    }
    __gnu_cxx::
    __normal_iterator<const_PartiallySignedTransaction_*,_std::vector<PartiallySignedTransaction,_std::allocator<PartiallySignedTransaction>_>_>
    ::operator++((__normal_iterator<const_PartiallySignedTransaction_*,_std::vector<PartiallySignedTransaction,_std::allocator<PartiallySignedTransaction>_>_>
                  *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  } while( true );
}

Assistant:

bool CombinePSBTs(PartiallySignedTransaction& out, const std::vector<PartiallySignedTransaction>& psbtxs)
{
    out = psbtxs[0]; // Copy the first one

    // Merge
    for (auto it = std::next(psbtxs.begin()); it != psbtxs.end(); ++it) {
        if (!out.Merge(*it)) {
            return false;
        }
    }
    return true;
}